

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.h
# Opt level: O3

void __thiscall crnlib::data_stream::~data_stream(data_stream *this)

{
  char *pcVar1;
  
  this->_vptr_data_stream = (_func_int **)&PTR__data_stream_001db2f0;
  pcVar1 = (this->m_name).m_pStr;
  if ((pcVar1 != (char *)0x0) && ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff))
  {
    crnlib_free(pcVar1 + -0x10);
  }
  return;
}

Assistant:

virtual ~data_stream() {}